

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::AJoint::Prepare(AJoint *this,btScalar dt,int iterations)

{
  Body *this_00;
  Body *this_01;
  btVector3 *this_02;
  btTransform *pbVar1;
  btMatrix3x3 *a;
  btMatrix3x3 *b;
  btScalar *this_03;
  AJoint *pAVar2;
  btScalar bVar3;
  btScalar bVar4;
  btVector3 bVar5;
  btScalar l;
  btMatrix3x3 local_90;
  btScalar local_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pAVar2 = this;
  bVar3 = (btScalar)(**(code **)(*(long *)this->m_icontrol + 0x10))();
  Joint::Prepare(&this->super_Joint,bVar3,(int)pAVar2);
  this_00 = (this->super_Joint).m_bodies;
  pbVar1 = Body::xform(this_00);
  bVar5 = operator*(&pbVar1->m_basis,(this->super_Joint).m_refs);
  *&this->m_axis[0].m_floats = bVar5.m_floats;
  this_01 = (this->super_Joint).m_bodies + 1;
  pbVar1 = Body::xform(this_01);
  bVar5 = operator*(&pbVar1->m_basis,(this->super_Joint).m_refs + 1);
  *&this->m_axis[1].m_floats = bVar5.m_floats;
  local_90.m_el[0] = btVector3::cross(this->m_axis + 1,this->m_axis);
  this_03 = (btScalar *)&local_90;
  local_60 = btVector3::length((btVector3 *)this_03);
  bVar5.m_floats = (btScalar  [4])ZEXT816(0);
  if (1.1920929e-07 < local_60) {
    bVar5 = operator/(local_90.m_el,&local_60);
  }
  this_02 = &(this->super_Joint).m_drift;
  *&(this->super_Joint).m_drift.m_floats = bVar5.m_floats;
  bVar4 = btVector3::dot(this->m_axis,this->m_axis + 1);
  bVar3 = 1.0;
  if (bVar4 <= 1.0) {
    bVar3 = bVar4;
  }
  bVar3 = btAcos((btScalar)
                 (-(uint)(bVar4 < -1.0) & 0xbf800000 | ~-(uint)(bVar4 < -1.0) & (uint)bVar3));
  if (0.19634955 < bVar3) {
    this_03 = &Prepare::maxdrift;
  }
  local_90.m_el[0].m_floats[0] = bVar3;
  btVector3::operator*=(this_02,this_03);
  local_90.m_el[0].m_floats[0] = (this->super_Joint).m_erp / dt;
  btVector3::operator*=(this_02,(btScalar *)&local_90);
  a = Body::invWorldInertia(this_00);
  b = Body::invWorldInertia(this_01);
  Add(&local_90,a,b);
  btMatrix3x3::inverse(&local_90);
  *(ulong *)(this->super_Joint).m_massmatrix.m_el[0].m_floats = CONCAT44(uStack_5c,local_60);
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[0].m_floats + 2) = uStack_58;
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[1].m_floats = local_50;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[1].m_floats + 2) = uStack_48;
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[2].m_floats = local_40;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[2].m_floats + 2) = uStack_38;
  if (0.0 < (this->super_Joint).m_split) {
    local_90.m_el[0] = operator*(this_02,&(this->super_Joint).m_split);
    bVar5 = operator*(&(this->super_Joint).m_massmatrix,local_90.m_el);
    *&(this->super_Joint).m_sdrift.m_floats = bVar5.m_floats;
    local_90.m_el[0].m_floats[0] = 1.0 - (this->super_Joint).m_split;
    btVector3::operator*=(this_02,(btScalar *)&local_90);
  }
  local_90.m_el[0].m_floats[0] = (float)iterations;
  btVector3::operator/=(this_02,(btScalar *)&local_90);
  return;
}

Assistant:

void				btSoftBody::AJoint::Prepare(btScalar dt,int iterations)
{
	static const btScalar	maxdrift=SIMD_PI/16;
	m_icontrol->Prepare(this);
	Joint::Prepare(dt,iterations);
	m_axis[0]	=	m_bodies[0].xform().getBasis()*m_refs[0];
	m_axis[1]	=	m_bodies[1].xform().getBasis()*m_refs[1];
	m_drift		=	NormalizeAny(btCross(m_axis[1],m_axis[0]));
	m_drift		*=	btMin(maxdrift,btAcos(Clamp<btScalar>(btDot(m_axis[0],m_axis[1]),-1,+1)));
	m_drift		*=	m_erp/dt;
	m_massmatrix=	AngularImpulseMatrix(m_bodies[0].invWorldInertia(),m_bodies[1].invWorldInertia());
	if(m_split>0)
	{
		m_sdrift	=	m_massmatrix*(m_drift*m_split);
		m_drift		*=	1-m_split;
	}
	m_drift	/=(btScalar)iterations;
}